

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsStringToPointer(JsValueRef stringValue,WCHAR **stringPtr,size_t *stringLength)

{
  bool bVar1;
  int iVar2;
  charcount_t cVar3;
  JavascriptString *this;
  undefined4 extraout_var;
  JsErrorCode JVar4;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar4 = JsErrorInvalidArgument;
  if (((stringValue != (JsValueRef)0x0) && (JVar4 = JsErrorNullArgument, stringPtr != (WCHAR **)0x0)
      ) && (*stringPtr = (WCHAR *)0x0, stringLength != (size_t *)0x0)) {
    *stringLength = 0;
    bVar1 = Js::VarIs<Js::JavascriptString>(stringValue);
    JVar4 = JsErrorInvalidArgument;
    if (bVar1) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      this = Js::VarTo<Js::JavascriptString>(stringValue);
      iVar2 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x65])(this);
      *stringPtr = (WCHAR *)CONCAT44(extraout_var,iVar2);
      cVar3 = Js::JavascriptString::GetLength(this);
      *stringLength = (ulong)cVar3;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
      JVar4 = JsNoError;
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsStringToPointer(_In_ JsValueRef stringValue, _Outptr_result_buffer_(*stringLength) const WCHAR **stringPtr, _Out_ size_t *stringLength)
{
    VALIDATE_JSREF(stringValue);
    PARAM_NOT_NULL(stringPtr);
    *stringPtr = nullptr;
    PARAM_NOT_NULL(stringLength);
    *stringLength = 0;

    if (!Js::VarIs<Js::JavascriptString>(stringValue))
    {
        return JsErrorInvalidArgument;
    }

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        Js::JavascriptString *jsString = Js::VarTo<Js::JavascriptString>(stringValue);

        *stringPtr = jsString->GetSz();
        *stringLength = jsString->GetLength();
        return JsNoError;
    });
}